

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O3

void Msat_HeapPercolateUp(Msat_Order_t *p,int i)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  double *pdVar6;
  long lVar7;
  uint uVar8;
  
  piVar5 = p->vHeap->pArray;
  iVar3 = piVar5[i];
  lVar7 = (long)i;
  if (1 < (uint)i) {
    pdVar6 = p->pSat->pdActivity;
    dVar2 = pdVar6[iVar3];
    do {
      uVar8 = i >> 1;
      iVar4 = piVar5[(int)uVar8];
      pdVar1 = pdVar6 + iVar4;
      lVar7 = (long)i;
      if (dVar2 < *pdVar1 || dVar2 == *pdVar1) break;
      piVar5[i] = iVar4;
      p->vIndex->pArray[iVar4] = i;
      lVar7 = (long)(int)uVar8;
      i = uVar8;
    } while (1 < uVar8);
  }
  piVar5[lVar7] = iVar3;
  p->vIndex->pArray[iVar3] = i;
  return;
}

Assistant:

void Msat_HeapPercolateUp( Msat_Order_t * p, int i )
{
    int x = HHEAP(p, i);
    while ( HPARENT(i) != 0 && HCOMPARE(p, x, HHEAP(p, HPARENT(i))) )
    {
        p->vHeap->pArray[i]            = HHEAP(p, HPARENT(i));
        p->vIndex->pArray[HHEAP(p, i)] = i;
        i                              = HPARENT(i);
    }
    p->vHeap->pArray[i]  = x;
    p->vIndex->pArray[x] = i;
}